

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftverify.c
# Opt level: O1

int ftverify_work(char *infile,char *outfile,int prehead,int prstat,char *errreport,int testdata,
                 int testcsum,int testfill,int heasarc_conv,int testhierarch)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  FILE *pFVar4;
  undefined8 *puVar5;
  char *pcVar6;
  float fversion;
  char task [80];
  float local_18c;
  undefined4 local_188;
  undefined1 local_184;
  undefined7 local_138;
  undefined4 uStack_131;
  
  if ((byte)(*errreport | 0x20U) == 0x73) {
    err_report = 2;
  }
  if ((byte)(*errreport | 0x20U) == 0x65) {
    err_report = 1;
  }
  if (*infile == '@') {
    __stream = fopen(infile + 1,"r");
    if (__stream == (FILE *)0x0) {
      ftverify_work_cold_1();
      return 0x68;
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  if (prstat == 0) {
    pFVar4 = (FILE *)0x0;
    goto LAB_00103f7b;
  }
  if ((((*outfile != '\0') && (iVar1 = strcmp(outfile,"STDOUT"), iVar1 != 0)) &&
      (iVar1 = strcmp(outfile,"STDERR"), iVar1 != 0)) &&
     (pFVar4 = fopen(outfile,"r"), pFVar4 != (FILE *)0x0)) {
    sprintf((char *)&local_138,"Clobber is not set. Cannot overwrite the file%s",outfile);
    leave_early((FILE *)0x0);
    fclose(pFVar4);
    return 0x69;
  }
  if ((*outfile == '\0') || (iVar1 = strcmp(outfile,"STDOUT"), iVar1 == 0)) {
LAB_00103f6c:
    puVar5 = (undefined8 *)&stdout;
  }
  else {
    iVar1 = strcmp(outfile,"STDERR");
    if (iVar1 != 0) {
      pFVar4 = fopen(outfile,"w");
      if (pFVar4 != (FILE *)0x0) goto LAB_00103f7b;
      fprintf(_stderr,"Error open output file %s. Using stdout instead.",outfile);
      goto LAB_00103f6c;
    }
    puVar5 = (undefined8 *)&stderr;
  }
  pFVar4 = (FILE *)*puVar5;
LAB_00103f7b:
  wrtout((FILE *)pFVar4," ");
  ffvers(&local_18c);
  local_138 = 0x72657673746966;
  uStack_131 = 0x796669;
  local_188 = 0x32322e34;
  local_184 = 0;
  sprintf(comm,"%s %s (CFITSIO V%.3f)",SUB84((double)local_18c,0));
  wrtsep((FILE *)pFVar4,' ',comm,0x3c);
  if (comm[0] != '\0') {
    pcVar6 = comm;
    do {
      pcVar6 = pcVar6 + 1;
      pcVar6[-1] = '-';
    } while (*pcVar6 != '\0');
  }
  wrtsep((FILE *)pFVar4,' ',comm,0x3c);
  wrtout((FILE *)pFVar4," ");
  if (err_report == 2) {
    builtin_strncpy(comm + 0x10,"ecking for the most severe FITS format errors.",0x2f);
    builtin_strncpy(comm,"Caution: Only ch",0x10);
    wrtout((FILE *)pFVar4,comm);
  }
  if (heasarc_conv != 0) {
    builtin_strncpy(comm,"HEASARC conventions are being checked.",0x27);
    wrtout((FILE *)pFVar4,comm);
  }
  if (testhierarch != 0) {
    builtin_strncpy(comm + 0x10,"words are being checked.",0x19);
    builtin_strncpy(comm,"ESO HIERARCH key",0x10);
    wrtout((FILE *)pFVar4,comm);
  }
  if (__stream == (FILE *)0x0) {
    iVar1 = verify_fits(infile,(FILE *)pFVar4);
    if (pFVar4 == (FILE *)0x0) {
      uVar2 = 1;
      if (iVar1 == 0) {
        uVar2 = get_total_err();
      }
      uVar3 = get_total_warn();
      if (uVar3 + uVar2 == 0 || SCARRY4(uVar3,uVar2) != (int)(uVar3 + uVar2) < 0) {
        printf("verification OK: %-20s\n",infile);
      }
      else if (err_report == 0) {
        printf("verification FAILED: %-20s, %d warnings and %d errors\n",infile,(ulong)uVar3,
               (ulong)uVar2);
      }
      else {
        printf("verification FAILED: %-20s, %d errors\n",infile,(ulong)uVar2);
      }
    }
  }
  else {
    pcVar6 = fgets(infile,0x401,__stream);
    while (pcVar6 != (char *)0x0) {
      iVar1 = verify_fits(infile,(FILE *)pFVar4);
      if (pFVar4 == (FILE *)0x0) {
        uVar2 = 1;
        if (iVar1 == 0) {
          uVar2 = get_total_err();
        }
        uVar3 = get_total_warn();
        if (uVar3 + uVar2 == 0 || SCARRY4(uVar3,uVar2) != (int)(uVar3 + uVar2) < 0) {
          printf("verification OK: %-20s\n",infile);
        }
        else if (err_report == 0) {
          printf("verification FAILED: %-20s, %d warnings and %d errors\n",infile,(ulong)uVar3,
                 (ulong)uVar2);
        }
        else {
          printf("verification FAILED: %-20s, %d errors\n",infile,(ulong)uVar2);
        }
      }
      iVar1 = 2;
      do {
        wrtout((FILE *)pFVar4," ");
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      pcVar6 = fgets(infile,0x401,__stream);
    }
    fclose(__stream);
  }
  if ((pFVar4 != (FILE *)0x0) && (pFVar4 != _stdout)) {
    fclose(pFVar4);
  }
  return 0;
}

Assistant:

int ftverify_work(
    char *infile,   /* I - Input file name (Fits) */
    char *outfile,  /* I - Output file name (ASCII) */
    int  prehead,  
    int  prstat,
    char * errreport,
    int  testdata,
    int  testcsum,
    int  testfill,
    int  heasarc_conv,
    int  testhierarch)

/* call work function to verify that infile conforms to the FITS
       standard and write report to the output file */
{
#ifdef WEBTOOL
    FILE *runfile = 0;
    int runnum;
    char runchars[30];
#endif
    FILE *outfptr = 0;
    FILE *list=0;
    int status = 0, vfstatus = 0, filestatus;
    char * p;
    char task[80];
    char tversion[80];
    float fversion;
    int i, nerrs, nwarns;
    char msg[MAXMSG];

    /* determine 'Severe error", "Error", or "Warning" report level */
    if( *errreport == 's' || *errreport == 'S') err_report = 2;
    if( *errreport == 'e' || *errreport == 'E') err_report = 1;

    p = infile;
    if (*p == '@') {
         p++;
         if( (list = fopen(p,"r")) == NULL ) {
                fprintf(stderr,"Cannot open the list file: %s.",p);
                leave_early(NULL);
                return (FILE_NOT_OPENED);
         }
    }

    headas_clobberfile(outfile);  /* delete existing file if clobber=YES */
    p = outfile;

    /* test if writing output log to a disk file */
    if(prstat && strlen(p) && strcmp(p, "STDOUT") && strcmp(p, "STDERR")
      && (outfptr = fopen(p,"r") ) != NULL ) {
      sprintf(msg,"Clobber is not set. Cannot overwrite the file%s",p);
      status = FILE_NOT_CREATED;
      HD_ERROR_THROW(msg,status);
      leave_early(NULL);
      fclose(outfptr);
      return (status);
    }

    if(prstat && (!strlen(p) || !strcmp(p, "STDOUT"))) {
       outfptr = stdout;
    }
    else if(prstat && (!strlen(p) || !strcmp(p, "STDERR"))) {
       outfptr = stderr;
    }
    else if (!prstat) {
       outfptr=NULL;
    }  
    else if( (outfptr = fopen(p,"w") ) == NULL) {
       fprintf(stderr,"Error open output file %s. Using stdout instead.",
           outfile);
       outfptr = stdout;
    }

#ifdef WEBTOOL
    /* try opening and incrementing the file containing cumulative # of runs */
    runfile=fopen("/tmp.shared/fits/tmpverify/counter.fitsverify","r+"); 
/*    runfile=fopen("counter.fitsverify","r+"); */
    if (runfile) {
        fgets(runchars,20,runfile);
	runnum=atoi(runchars);
	runnum++;
	sprintf(comm,"                                           Run Number %d",runnum);
	wrtout(outfptr,comm);
        sprintf(runchars, "%d", runnum);
	fflush(runfile);
	rewind(runfile);
	fputs(runchars, runfile);
    }

#endif

    wrtout(outfptr," ");
    fits_get_version(&fversion);
    get_toolname(task); 
    get_toolversion(tversion); 
    sprintf(comm,"%s %s (CFITSIO V%.3f)",task,tversion,fversion);
    wrtsep(outfptr,' ',comm,60);
    for(i = 0; comm[i]!='\0'; i++) comm[i] = '-';
    wrtsep(outfptr,' ',comm,60);
    wrtout(outfptr," ");
    switch (err_report) {
    case 2:
    sprintf(comm, "Caution: Only checking for the most severe FITS format errors.");
        wrtout(outfptr,comm);
        break;
    case 1:
        break;
    case 0:
        break;
    }

    if(heasarc_conv) {
        sprintf(comm, "HEASARC conventions are being checked.");
        wrtout(outfptr,comm);
    }

    if(testhierarch) {
        sprintf(comm, "ESO HIERARCH keywords are being checked.");
        wrtout(outfptr,comm);
    }

    /* process each file */
    if (list == NULL) {
        vfstatus = verify_fits(infile,outfptr);

        if (outfptr == NULL) {  /* print one-line file summary */

           /* verify_fits returns a non-zero status for catastrophic
            * file I/O problems (an abort), and in this case total_err
            * is not updated via close_report(), so we need to set
            * nerrs accordingly for the one-line file summary. */
           if (vfstatus) nerrs = 1; else nerrs = get_total_err();

           nwarns = get_total_warn();

           filestatus = ((nerrs+nwarns)>0) ? 1 : 0;
	   if (filestatus)
	   {
	     if (err_report)
                printf("verification FAILED: %-20s, %d errors\n", 
	           infile, nerrs);
             else 
                printf("verification FAILED: %-20s, %d warnings and %d errors\n", 
	           infile, nwarns, nerrs);
           }
	   else
             printf("verification OK: %-20s\n", infile);
        }        
    }
    else {
       while((p = fgets(infile, FLEN_FILENAME, list))!= NULL) {
           vfstatus = verify_fits(infile,outfptr);

           if (outfptr == NULL) { /* print one-line file summary */

              /* verify_fits returns a non-zero status for catastrophic
               * file I/O problems (an abort), and in this case total_err
               * is not updated via close_report(), so we need to set
               * nerrs accordingly for the one-line file summary. */
              if (vfstatus) nerrs = 1; else nerrs = get_total_err();

              nwarns = get_total_warn();

              filestatus = ((nerrs+nwarns) >0) ? 1 : 0;
	      if (filestatus)
	      {
	        if (err_report)
                   printf("verification FAILED: %-20s, %d errors\n", 
	              infile, nerrs);
                else 
                   printf("verification FAILED: %-20s, %d warnings and %d errors\n", 
	              infile, nwarns, nerrs);
              }
              else
                 printf("verification OK: %-20s\n", infile);
           }        

           for (i = 1; i < 3; i++) wrtout(outfptr," ");
       }
       fclose(list);
    }

    /* close the output file  */ 
    if (outfptr != stdout && outfptr != NULL) fclose(outfptr);

    return(status);
}